

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlined_vector.h
# Opt level: O0

Reference<std::allocator<absl::lts_20250127::status_internal::Payload>_> __thiscall
absl::lts_20250127::inlined_vector_internal::
Storage<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>
::EmplaceBack<absl::lts_20250127::status_internal::Payload>
          (Storage<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>
           *this,Payload *args)

{
  allocator<absl::lts_20250127::status_internal::Payload> *__a;
  Pointer<std::allocator<absl::lts_20250127::status_internal::Payload>_> last_ptr;
  SizeType<std::allocator<absl::lts_20250127::status_internal::Payload>_> n;
  StorageView<std::allocator<absl::lts_20250127::status_internal::Payload>_> storage_view;
  Payload *args_local;
  Storage<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>
  *this_local;
  
  storage_view.capacity =
       (SizeType<std::allocator<absl::lts_20250127::status_internal::Payload>_>)args;
  MakeStorageView((StorageView<std::allocator<absl::lts_20250127::status_internal::Payload>_> *)&n,
                  this);
  if (storage_view.data ==
      (Pointer<std::allocator<absl::lts_20250127::status_internal::Payload>_>)storage_view.size) {
    this_local = (Storage<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>
                  *)EmplaceBackSlow<absl::lts_20250127::status_internal::Payload>
                              (this,(Payload *)storage_view.capacity);
  }
  else {
    this_local = (Storage<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>
                  *)(n + (long)storage_view.data * 0x30);
    __a = GetAllocator(this);
    std::allocator_traits<std::allocator<absl::lts_20250127::status_internal::Payload>>::
    construct<absl::lts_20250127::status_internal::Payload,absl::lts_20250127::status_internal::Payload>
              (__a,(Payload *)this_local,(Payload *)storage_view.capacity);
    AddSize(this,1);
  }
  return (Reference<std::allocator<absl::lts_20250127::status_internal::Payload>_>)this_local;
}

Assistant:

auto Storage<T, N, A>::EmplaceBack(Args&&... args) -> Reference<A> {
  StorageView<A> storage_view = MakeStorageView();
  const SizeType<A> n = storage_view.size;
  if (ABSL_PREDICT_TRUE(n != storage_view.capacity)) {
    // Fast path; new element fits.
    Pointer<A> last_ptr = storage_view.data + n;
    AllocatorTraits<A>::construct(GetAllocator(), last_ptr,
                                  std::forward<Args>(args)...);
    AddSize(1);
    return *last_ptr;
  }
  // TODO(b/173712035): Annotate with musttail attribute to prevent regression.
  return EmplaceBackSlow(std::forward<Args>(args)...);
}